

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  CppType CVar4;
  uint32 uVar5;
  uint uVar6;
  cpp *this_00;
  protobuf *this_01;
  long lVar7;
  char *pcVar8;
  EnumDescriptor *this_02;
  EnumValueDescriptor *this_03;
  string *src;
  LogMessage *other;
  undefined1 qualified;
  int number;
  uint i;
  int number_00;
  FieldDescriptor *field_00;
  int64 number_01;
  unsigned_long i_00;
  float fVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  SubstituteArg *in_stack_fffffffffffffb98;
  allocator *paVar13;
  allocator local_39a;
  LogFinisher local_399;
  LogMessage local_398;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  SubstituteArg local_2c0;
  SubstituteArg local_290;
  SubstituteArg local_260;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  string local_140;
  SubstituteArg local_120;
  string local_f0;
  SubstituteArg local_d0;
  allocator local_9d;
  undefined1 local_9c;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  float local_98;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  float value_1;
  double value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_38;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  string *float_value;
  
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  qualified = 0xd0;
  switch(CVar4) {
  case CPPTYPE_INT32:
    uVar6 = FieldDescriptor::default_value_int32(local_18);
    Int32ToString_abi_cxx11_(__return_storage_ptr__,(cpp *)(ulong)uVar6,number);
    break;
  case CPPTYPE_INT64:
    this_00 = (cpp *)FieldDescriptor::default_value_int64(local_18);
    Int64ToString_abi_cxx11_(__return_storage_ptr__,this_00,number_01);
    break;
  case CPPTYPE_UINT32:
    uVar5 = FieldDescriptor::default_value_uint32(local_18);
    SimpleItoa_abi_cxx11_(&local_38,(protobuf *)(ulong)uVar5,i);
    std::operator+(__return_storage_ptr__,&local_38,"u");
    std::__cxx11::string::~string((string *)&local_38);
    break;
  case CPPTYPE_UINT64:
    this_01 = (protobuf *)FieldDescriptor::default_value_uint64(local_18);
    SimpleItoa_abi_cxx11_((string *)&value,this_01,i_00);
    std::operator+(&local_68,"GOOGLE_ULONGLONG(",(string *)&value);
    std::operator+(__return_storage_ptr__,&local_68,")");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&value);
    break;
  case CPPTYPE_DOUBLE:
    dVar11 = FieldDescriptor::default_value_double(local_18);
    _value_1 = dVar11;
    dVar12 = std::numeric_limits<double>::infinity();
    dVar2 = _value_1;
    if ((dVar11 != dVar12) || (NAN(dVar11) || NAN(dVar12))) {
      dVar11 = std::numeric_limits<double>::infinity();
      if ((dVar2 != -dVar11) || (NAN(dVar2) || NAN(-dVar11))) {
        if (NAN(_value_1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"::google::protobuf::internal::NaN()",
                     &local_93);
          std::allocator<char>::~allocator((allocator<char> *)&local_93);
        }
        else {
          SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this,_value_1);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"-::google::protobuf::internal::Infinity()",
                   &local_92);
        std::allocator<char>::~allocator((allocator<char> *)&local_92);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"::google::protobuf::internal::Infinity()",
                 &local_91);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    break;
  case CPPTYPE_FLOAT:
    fVar9 = FieldDescriptor::default_value_float(local_18);
    local_98 = fVar9;
    fVar10 = std::numeric_limits<float>::infinity();
    fVar1 = local_98;
    if ((fVar9 != fVar10) || (NAN(fVar9) || NAN(fVar10))) {
      fVar9 = std::numeric_limits<float>::infinity();
      if ((fVar1 != -fVar9) || (NAN(fVar1) || NAN(-fVar9))) {
        if (NAN(local_98)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,
                     "static_cast<float>(::google::protobuf::internal::NaN())",&local_9b);
          std::allocator<char>::~allocator((allocator<char> *)&local_9b);
        }
        else {
          local_9c = 0;
          SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this,local_98);
          lVar7 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x5d0d36);
          if (lVar7 != -1) {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,
                   "static_cast<float>(-::google::protobuf::internal::Infinity())",&local_9a);
        std::allocator<char>::~allocator((allocator<char> *)&local_9a);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 "static_cast<float>(::google::protobuf::internal::Infinity())",&local_99);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    break;
  case CPPTYPE_BOOL:
    bVar3 = FieldDescriptor::default_value_bool(local_18);
    pcVar8 = "false";
    if (bVar3) {
      pcVar8 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar8,&local_9d);
    std::allocator<char>::~allocator((allocator<char> *)&local_9d);
    break;
  case CPPTYPE_ENUM:
    this_02 = FieldDescriptor::enum_type(local_18);
    ClassName_abi_cxx11_(&local_f0,(cpp *)this_02,(EnumDescriptor *)0x1,(bool)qualified);
    strings::internal::SubstituteArg::SubstituteArg(&local_d0,&local_f0);
    this_03 = FieldDescriptor::default_value_enum(local_18);
    uVar6 = EnumValueDescriptor::number(this_03);
    Int32ToString_abi_cxx11_(&local_140,(cpp *)(ulong)uVar6,number_00);
    strings::internal::SubstituteArg::SubstituteArg(&local_120,&local_140);
    strings::internal::SubstituteArg::SubstituteArg(&local_170);
    strings::internal::SubstituteArg::SubstituteArg(&local_1a0);
    strings::internal::SubstituteArg::SubstituteArg(&local_1d0);
    strings::internal::SubstituteArg::SubstituteArg(&local_200);
    strings::internal::SubstituteArg::SubstituteArg(&local_230);
    strings::internal::SubstituteArg::SubstituteArg(&local_260);
    strings::internal::SubstituteArg::SubstituteArg(&local_290);
    strings::internal::SubstituteArg::SubstituteArg(&local_2c0);
    strings::Substitute_abi_cxx11_
              (__return_storage_ptr__,(strings *)"static_cast< $0 >($1)",(char *)&local_d0,
               &local_120,&local_170,&local_1a0,&local_1d0,&local_200,&local_230,&local_260,
               &local_290,&local_2c0,in_stack_fffffffffffffb98);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_f0);
    break;
  case CPPTYPE_STRING:
    src = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
    CEscape(&local_320,src);
    EscapeTrigraphs(&local_300,&local_320);
    std::operator+(&local_2e0,"\"",&local_300);
    std::operator+(__return_storage_ptr__,&local_2e0,"\"");
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    break;
  case CPPTYPE_MESSAGE:
    FieldMessageTypeName_abi_cxx11_(&local_360,(cpp *)local_18,field_00);
    std::operator+(&local_340,"*",&local_360);
    std::operator+(__return_storage_ptr__,&local_340,"::internal_default_instance()");
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_398,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x1a8);
    other = internal::LogMessage::operator<<(&local_398,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_399,other);
    internal::LogMessage::~LogMessage(&local_398);
    paVar13 = &local_39a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",paVar13);
    std::allocator<char>::~allocator((allocator<char> *)&local_39a);
  }
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return Int32ToString(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return SimpleItoa(field->default_value_uint32()) + "u";
    case FieldDescriptor::CPPTYPE_INT64:
      return Int64ToString(field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT64:
      return "GOOGLE_ULONGLONG(" + SimpleItoa(field->default_value_uint64())+ ")";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "::google::protobuf::internal::Infinity()";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "-::google::protobuf::internal::Infinity()";
      } else if (value != value) {
        return "::google::protobuf::internal::NaN()";
      } else {
        return SimpleDtoa(value);
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT:
      {
        float value = field->default_value_float();
        if (value == std::numeric_limits<float>::infinity()) {
          return "static_cast<float>(::google::protobuf::internal::Infinity())";
        } else if (value == -std::numeric_limits<float>::infinity()) {
          return "static_cast<float>(-::google::protobuf::internal::Infinity())";
        } else if (value != value) {
          return "static_cast<float>(::google::protobuf::internal::NaN())";
        } else {
          string float_value = SimpleFtoa(value);
          // If floating point value contains a period (.) or an exponent
          // (either E or e), then append suffix 'f' to make it a float
          // literal.
          if (float_value.find_first_of(".eE") != string::npos) {
            float_value.push_back('f');
          }
          return float_value;
        }
      }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      // Lazy:  Generate a static_cast because we don't have a helper function
      //   that constructs the full name of an enum value.
      return strings::Substitute(
          "static_cast< $0 >($1)",
          ClassName(field->enum_type(), true),
          Int32ToString(field->default_value_enum()->number()));
    case FieldDescriptor::CPPTYPE_STRING:
      return "\"" + EscapeTrigraphs(
        CEscape(field->default_value_string())) +
        "\"";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "*" + FieldMessageTypeName(field) +
             "::internal_default_instance()";
  }
  // Can't actually get here; make compiler happy.  (We could add a default
  // case above but then we wouldn't get the nice compiler warning when a
  // new type is added.)
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}